

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecuteProcessCommand.cxx
# Opt level: O2

bool __thiscall
cmExecuteProcessCommand::InitialPass
          (cmExecuteProcessCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pvVar1;
  pointer pvVar2;
  bool bVar3;
  bool bVar4;
  bool strip_trailing_whitespace;
  bool strip_trailing_whitespace_00;
  bool bVar5;
  __type _Var6;
  int iVar7;
  pointer pbVar8;
  long lVar9;
  cmsysProcess *cp;
  char *value;
  ostream *poVar10;
  bool bVar11;
  pointer pbVar12;
  vector<char,_std::allocator<char>_> *output;
  uint uVar13;
  cmMakefile *this_00;
  ulong uVar14;
  vector<char,_std::allocator<char>_> tempOutput;
  int length;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  cmds;
  char *data;
  double timeout;
  string output_variable;
  string output_file;
  vector<char,_std::allocator<char>_> tempError;
  string result_variable;
  string error_variable;
  string error_file;
  string working_directory;
  string input_file;
  string timeout_string;
  ostringstream e;
  string arguments;
  
  pbVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar8 == pbVar12) {
    std::__cxx11::string::string
              ((string *)&e,"called with incorrect number of arguments",(allocator *)&arguments);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    return false;
  }
  cmds.
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arguments._M_dataplus._M_p = (pointer)&arguments.field_2;
  arguments._M_string_length = 0;
  cmds.
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmds.
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar5 = false;
  timeout_string._M_dataplus._M_p = (pointer)&timeout_string.field_2;
  timeout_string._M_string_length = 0;
  input_file._M_dataplus._M_p = (pointer)&input_file.field_2;
  input_file._M_string_length = 0;
  arguments.field_2._M_local_buf[0] = '\0';
  timeout_string.field_2._M_local_buf[0] = '\0';
  output_file._M_dataplus._M_p = (pointer)&output_file.field_2;
  output_file._M_string_length = 0;
  error_file._M_dataplus._M_p = (pointer)&error_file.field_2;
  error_file._M_string_length = 0;
  input_file.field_2._M_local_buf[0] = '\0';
  output_file.field_2._M_local_buf[0] = '\0';
  output_variable._M_dataplus._M_p = (pointer)&output_variable.field_2;
  output_variable._M_string_length = 0;
  error_variable._M_dataplus._M_p = (pointer)&error_variable.field_2;
  error_variable._M_string_length = 0;
  error_file.field_2._M_local_buf[0] = '\0';
  output_variable.field_2._M_local_buf[0] = '\0';
  result_variable._M_dataplus._M_p = (pointer)&result_variable.field_2;
  result_variable._M_string_length = 0;
  working_directory._M_dataplus._M_p = (pointer)&working_directory.field_2;
  working_directory._M_string_length = 0;
  error_variable.field_2._M_local_buf[0] = '\0';
  result_variable.field_2._M_local_buf[0] = '\0';
  working_directory.field_2._M_local_buf[0] = '\0';
  lVar9 = 0;
  bVar4 = false;
  bVar11 = false;
  strip_trailing_whitespace = false;
  strip_trailing_whitespace_00 = false;
  for (uVar14 = 0; uVar14 < (ulong)((long)pbVar8 - (long)pbVar12 >> 5); uVar14 = uVar14 + 1) {
    bVar3 = std::operator==(pbVar12 + uVar14,"COMMAND");
    pvVar2 = cmds.
             super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pvVar1 = cmds.
             super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (bVar3) {
      _e = (pointer)0x0;
      std::
      vector<std::vector<char_const*,std::allocator<char_const*>>,std::allocator<std::vector<char_const*,std::allocator<char_const*>>>>
      ::emplace_back<std::vector<char_const*,std::allocator<char_const*>>>
                ((vector<std::vector<char_const*,std::allocator<char_const*>>,std::allocator<std::vector<char_const*,std::allocator<char_const*>>>>
                  *)&cmds,(vector<const_char_*,_std::allocator<const_char_*>_> *)&e);
      lVar9 = ((long)pvVar2 - (long)pvVar1) / 0x18;
      std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&e);
LAB_002fa84b:
      bVar5 = true;
    }
    else {
      bVar3 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar14,"OUTPUT_VARIABLE")
      ;
      if (bVar3) {
        uVar14 = uVar14 + 1;
        if ((ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar14) {
          std::__cxx11::string::string
                    ((string *)&e," called with no value for OUTPUT_VARIABLE.",
                     (allocator *)&tempOutput);
          cmCommand::SetError(&this->super_cmCommand,(string *)&e);
          goto LAB_002fb268;
        }
        std::__cxx11::string::_M_assign((string *)&output_variable);
      }
      else {
        bVar3 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar14,"ERROR_VARIABLE"
                               );
        if (bVar3) {
          uVar14 = uVar14 + 1;
          if ((ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar14) {
            std::__cxx11::string::string
                      ((string *)&e," called with no value for ERROR_VARIABLE.",
                       (allocator *)&tempOutput);
            cmCommand::SetError(&this->super_cmCommand,(string *)&e);
            goto LAB_002fb268;
          }
          std::__cxx11::string::_M_assign((string *)&error_variable);
        }
        else {
          bVar3 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar14,
                                  "RESULT_VARIABLE");
          if (bVar3) {
            uVar14 = uVar14 + 1;
            if ((ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar14) {
              std::__cxx11::string::string
                        ((string *)&e," called with no value for RESULT_VARIABLE.",
                         (allocator *)&tempOutput);
              cmCommand::SetError(&this->super_cmCommand,(string *)&e);
              goto LAB_002fb268;
            }
            std::__cxx11::string::_M_assign((string *)&result_variable);
          }
          else {
            bVar3 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar14,
                                    "WORKING_DIRECTORY");
            if (bVar3) {
              uVar14 = uVar14 + 1;
              if ((ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar14) {
                std::__cxx11::string::string
                          ((string *)&e," called with no value for WORKING_DIRECTORY.",
                           (allocator *)&tempOutput);
                cmCommand::SetError(&this->super_cmCommand,(string *)&e);
                goto LAB_002fb268;
              }
              std::__cxx11::string::_M_assign((string *)&working_directory);
            }
            else {
              bVar3 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar14,
                                      "INPUT_FILE");
              if (bVar3) {
                uVar14 = uVar14 + 1;
                if ((ulong)((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar14) {
                  std::__cxx11::string::string
                            ((string *)&e," called with no value for INPUT_FILE.",
                             (allocator *)&tempOutput);
                  cmCommand::SetError(&this->super_cmCommand,(string *)&e);
                  goto LAB_002fb268;
                }
                std::__cxx11::string::_M_assign((string *)&input_file);
              }
              else {
                bVar3 = std::operator==((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar14,
                                        "OUTPUT_FILE");
                if (bVar3) {
                  uVar14 = uVar14 + 1;
                  if ((ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar14) {
                    std::__cxx11::string::string
                              ((string *)&e," called with no value for OUTPUT_FILE.",
                               (allocator *)&tempOutput);
                    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
                    goto LAB_002fb268;
                  }
                  std::__cxx11::string::_M_assign((string *)&output_file);
                }
                else {
                  bVar3 = std::operator==((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar14,
                                          "ERROR_FILE");
                  if (bVar3) {
                    uVar14 = uVar14 + 1;
                    if ((ulong)((long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar14) {
                      std::__cxx11::string::string
                                ((string *)&e," called with no value for ERROR_FILE.",
                                 (allocator *)&tempOutput);
                      cmCommand::SetError(&this->super_cmCommand,(string *)&e);
                      goto LAB_002fb268;
                    }
                    std::__cxx11::string::_M_assign((string *)&error_file);
                  }
                  else {
                    bVar3 = std::operator==((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar14,
                                            "TIMEOUT");
                    if (bVar3) {
                      uVar14 = uVar14 + 1;
                      if ((ulong)((long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar14)
                      {
                        std::__cxx11::string::string
                                  ((string *)&e," called with no value for TIMEOUT.",
                                   (allocator *)&tempOutput);
                        cmCommand::SetError(&this->super_cmCommand,(string *)&e);
                        goto LAB_002fb268;
                      }
                      std::__cxx11::string::_M_assign((string *)&timeout_string);
                    }
                    else {
                      bVar3 = std::operator==((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar14,
                                              "OUTPUT_QUIET");
                      if (bVar3) {
                        bVar4 = true;
                      }
                      else {
                        bVar3 = std::operator==((args->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start + uVar14,
                                                "ERROR_QUIET");
                        if (bVar3) {
                          bVar11 = true;
                        }
                        else {
                          bVar3 = std::operator==((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar14,"OUTPUT_STRIP_TRAILING_WHITESPACE");
                          if (bVar3) {
                            strip_trailing_whitespace = true;
                          }
                          else {
                            bVar3 = std::operator==((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar14,"ERROR_STRIP_TRAILING_WHITESPACE");
                            if (!bVar3) {
                              if (bVar5) {
                                _e = (args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus.
                                     _M_p;
                                std::vector<char_const*,std::allocator<char_const*>>::
                                emplace_back<char_const*>
                                          ((vector<char_const*,std::allocator<char_const*>> *)
                                           (cmds.
                                            super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar9),
                                           (char **)&e);
                                goto LAB_002fa84b;
                              }
                              std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                              poVar10 = std::operator<<((ostream *)&e," given unknown argument \"");
                              poVar10 = std::operator<<(poVar10,(string *)
                                                                ((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar14));
                              std::operator<<(poVar10,"\".");
                              std::__cxx11::stringbuf::str();
                              cmCommand::SetError(&this->super_cmCommand,(string *)&tempOutput);
                              std::__cxx11::string::~string((string *)&tempOutput);
                              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
                              goto LAB_002fb275;
                            }
                            strip_trailing_whitespace_00 = true;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      bVar5 = false;
    }
    pbVar12 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  bVar5 = cmMakefile::CanIWriteThisFile
                    ((this->super_cmCommand).Makefile,output_file._M_dataplus._M_p);
  if (!bVar5) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tempOutput,
                   "attempted to output into a file: ",&output_file);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tempOutput,
                   " into a source directory.");
    std::__cxx11::string::~string((string *)&tempOutput);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    cmSystemTools::s_FatalErrorOccured = true;
LAB_002fb268:
    std::__cxx11::string::~string((string *)&e);
LAB_002fb275:
    bVar11 = false;
    goto LAB_002fb277;
  }
  if (cmds.
      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      cmds.
      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string
              ((string *)&e," called with no COMMAND argument.",(allocator *)&tempOutput);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    goto LAB_002fb268;
  }
  for (uVar13 = 0; uVar14 = (ulong)uVar13,
      uVar14 < (ulong)(((long)cmds.
                              super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)cmds.
                             super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar13 = uVar13 + 1
      ) {
    if (cmds.
        super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar14].
        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        cmds.
        super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar14].
        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string
                ((string *)&e," given COMMAND argument with no value.",(allocator *)&tempOutput);
      cmCommand::SetError(&this->super_cmCommand,(string *)&e);
      goto LAB_002fb268;
    }
    _e = (pointer)0x0;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)
               (cmds.
                super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar14),(char **)&e);
  }
  timeout = -1.0;
  if ((timeout_string._M_string_length != 0) &&
     (iVar7 = __isoc99_sscanf(timeout_string._M_dataplus._M_p,"%lg",&timeout), iVar7 != 1)) {
    std::__cxx11::string::string
              ((string *)&e," called with TIMEOUT value that could not be parsed.",
               (allocator *)&tempOutput);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    goto LAB_002fb268;
  }
  cp = cmsysProcess_New();
  for (uVar13 = 0;
      (ulong)uVar13 <
      (ulong)(((long)cmds.
                     super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)cmds.
                    super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar13 = uVar13 + 1) {
    cmsysProcess_AddCommand
              (cp,cmds.
                  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar13].
                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start);
  }
  if (working_directory._M_string_length != 0) {
    cmsysProcess_SetWorkingDirectory(cp,working_directory._M_dataplus._M_p);
  }
  cmsysProcess_SetOption(cp,0,1);
  if (input_file._M_string_length != 0) {
    cmsysProcess_SetPipeFile(cp,1,input_file._M_dataplus._M_p);
  }
  if (output_file._M_string_length != 0) {
    cmsysProcess_SetPipeFile(cp,2,output_file._M_dataplus._M_p);
  }
  if (error_file._M_string_length == 0) {
LAB_002fae72:
    bVar5 = false;
  }
  else {
    _Var6 = std::operator==(&error_file,&output_file);
    bVar5 = true;
    if (!_Var6) {
      cmsysProcess_SetPipeFile(cp,3,error_file._M_dataplus._M_p);
      goto LAB_002fae72;
    }
  }
  if (output_variable._M_string_length == 0) {
    if (bVar5) goto LAB_002fae9d;
LAB_002faf15:
    bVar5 = false;
  }
  else {
    _Var6 = std::operator==(&output_variable,&error_variable);
    if (!_Var6 && !bVar5) goto LAB_002faf15;
LAB_002fae9d:
    bVar5 = true;
    cmsysProcess_SetOption(cp,2,1);
  }
  if (0.0 <= timeout) {
    cmsysProcess_SetTimeout(cp,timeout);
  }
  cmsysProcess_Execute(cp);
  tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
LAB_002faf6f:
  do {
    while (iVar7 = cmsysProcess_WaitForData(cp,&data,&length,(double *)0x0), iVar7 == 2) {
      if (!bVar4) {
        output = &tempOutput;
        if (output_variable._M_string_length == 0) {
          cmSystemTools::Stdout(data,(long)length);
        }
        else {
LAB_002fafd3:
          cmExecuteProcessCommandAppend(output,data,length);
        }
      }
    }
    if (iVar7 == 3) {
      if (!bVar11) {
        output = &tempError;
        if (error_variable._M_string_length != 0) goto LAB_002fafd3;
        cmSystemTools::Stderr(data,(long)length);
      }
      goto LAB_002faf6f;
    }
  } while (iVar7 != 0);
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  cmExecuteProcessCommandFixText(&tempOutput,strip_trailing_whitespace);
  cmExecuteProcessCommandFixText(&tempError,strip_trailing_whitespace_00);
  if ((output_variable._M_string_length != 0) &&
     (tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,&output_variable,
               tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  if ((!bVar5 && error_variable._M_string_length != 0) &&
     (tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,&error_variable,
               tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  if (result_variable._M_string_length == 0) goto switchD_002fb0c4_caseD_3;
  iVar7 = cmsysProcess_GetState(cp);
  switch(iVar7) {
  case 1:
    this_00 = (this->super_cmCommand).Makefile;
    value = cmsysProcess_GetErrorString(cp);
    goto LAB_002fb18b;
  case 2:
    this_00 = (this->super_cmCommand).Makefile;
    value = cmsysProcess_GetExceptionString(cp);
LAB_002fb18b:
    cmMakefile::AddDefinition(this_00,&result_variable,value);
    break;
  case 4:
    uVar13 = cmsysProcess_GetExitValue(cp);
    sprintf((char *)&e,"%d",(ulong)uVar13);
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&result_variable,(char *)&e);
    break;
  case 5:
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,&result_variable,"Process terminated due to timeout"
              );
  }
switchD_002fb0c4_caseD_3:
  cmsysProcess_Delete(cp);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&tempError.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&tempOutput.super__Vector_base<char,_std::allocator<char>_>);
  bVar11 = true;
LAB_002fb277:
  std::__cxx11::string::~string((string *)&working_directory);
  std::__cxx11::string::~string((string *)&result_variable);
  std::__cxx11::string::~string((string *)&error_variable);
  std::__cxx11::string::~string((string *)&output_variable);
  std::__cxx11::string::~string((string *)&error_file);
  std::__cxx11::string::~string((string *)&output_file);
  std::__cxx11::string::~string((string *)&input_file);
  std::__cxx11::string::~string((string *)&timeout_string);
  std::__cxx11::string::~string((string *)&arguments);
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::~vector(&cmds);
  return bVar11;
}

Assistant:

bool cmExecuteProcessCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  std::vector< std::vector<const char*> > cmds;
  std::string arguments;
  bool doing_command = false;
  size_t command_index = 0;
  bool output_quiet = false;
  bool error_quiet = false;
  bool output_strip_trailing_whitespace = false;
  bool error_strip_trailing_whitespace = false;
  std::string timeout_string;
  std::string input_file;
  std::string output_file;
  std::string error_file;
  std::string output_variable;
  std::string error_variable;
  std::string result_variable;
  std::string working_directory;
  for(size_t i=0; i < args.size(); ++i)
    {
    if(args[i] == "COMMAND")
      {
      doing_command = true;
      command_index = cmds.size();
      cmds.push_back(std::vector<const char*>());
      }
    else if(args[i] == "OUTPUT_VARIABLE")
      {
      doing_command = false;
      if(++i < args.size())
        {
        output_variable = args[i];
        }
      else
        {
        this->SetError(" called with no value for OUTPUT_VARIABLE.");
        return false;
        }
      }
    else if(args[i] == "ERROR_VARIABLE")
      {
      doing_command = false;
      if(++i < args.size())
        {
        error_variable = args[i];
        }
      else
        {
        this->SetError(" called with no value for ERROR_VARIABLE.");
        return false;
        }
      }
    else if(args[i] == "RESULT_VARIABLE")
      {
      doing_command = false;
      if(++i < args.size())
        {
        result_variable = args[i];
        }
      else
        {
        this->SetError(" called with no value for RESULT_VARIABLE.");
        return false;
        }
      }
    else if(args[i] == "WORKING_DIRECTORY")
      {
      doing_command = false;
      if(++i < args.size())
        {
        working_directory = args[i];
        }
      else
        {
        this->SetError(" called with no value for WORKING_DIRECTORY.");
        return false;
        }
      }
    else if(args[i] == "INPUT_FILE")
      {
      doing_command = false;
      if(++i < args.size())
        {
        input_file = args[i];
        }
      else
        {
        this->SetError(" called with no value for INPUT_FILE.");
        return false;
        }
      }
    else if(args[i] == "OUTPUT_FILE")
      {
      doing_command = false;
      if(++i < args.size())
        {
        output_file = args[i];
        }
      else
        {
        this->SetError(" called with no value for OUTPUT_FILE.");
        return false;
        }
      }
    else if(args[i] == "ERROR_FILE")
      {
      doing_command = false;
      if(++i < args.size())
        {
        error_file = args[i];
        }
      else
        {
        this->SetError(" called with no value for ERROR_FILE.");
        return false;
        }
      }
    else if(args[i] == "TIMEOUT")
      {
      doing_command = false;
      if(++i < args.size())
        {
        timeout_string = args[i];
        }
      else
        {
        this->SetError(" called with no value for TIMEOUT.");
        return false;
        }
      }
    else if(args[i] == "OUTPUT_QUIET")
      {
      doing_command = false;
      output_quiet = true;
      }
    else if(args[i] == "ERROR_QUIET")
      {
      doing_command = false;
      error_quiet = true;
      }
    else if(args[i] == "OUTPUT_STRIP_TRAILING_WHITESPACE")
      {
      doing_command = false;
      output_strip_trailing_whitespace = true;
      }
    else if(args[i] == "ERROR_STRIP_TRAILING_WHITESPACE")
      {
      doing_command = false;
      error_strip_trailing_whitespace = true;
      }
    else if(doing_command)
      {
      cmds[command_index].push_back(args[i].c_str());
      }
    else
      {
      std::ostringstream e;
      e << " given unknown argument \"" << args[i] << "\".";
      this->SetError(e.str());
      return false;
      }
    }

  if ( !this->Makefile->CanIWriteThisFile(output_file.c_str()) )
    {
    std::string e = "attempted to output into a file: " + output_file
      + " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
    }

  // Check for commands given.
  if(cmds.empty())
    {
    this->SetError(" called with no COMMAND argument.");
    return false;
    }
  for(unsigned int i=0; i < cmds.size(); ++i)
    {
    if(cmds[i].empty())
      {
      this->SetError(" given COMMAND argument with no value.");
      return false;
      }
    else
      {
      // Add the null terminating pointer to the command argument list.
      cmds[i].push_back(0);
      }
    }

  // Parse the timeout string.
  double timeout = -1;
  if(!timeout_string.empty())
    {
    if(sscanf(timeout_string.c_str(), "%lg", &timeout) != 1)
      {
      this->SetError(" called with TIMEOUT value that could not be parsed.");
      return false;
      }
    }

  // Create a process instance.
  cmsysProcess* cp = cmsysProcess_New();

  // Set the command sequence.
  for(unsigned int i=0; i < cmds.size(); ++i)
    {
    cmsysProcess_AddCommand(cp, &*cmds[i].begin());
    }

  // Set the process working directory.
  if(!working_directory.empty())
    {
    cmsysProcess_SetWorkingDirectory(cp, working_directory.c_str());
    }

  // Always hide the process window.
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);

  // Check the output variables.
  bool merge_output = false;
  if(!input_file.empty())
    {
    cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDIN, input_file.c_str());
    }
  if(!output_file.empty())
    {
    cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDOUT,
                             output_file.c_str());
    }
  if(!error_file.empty())
    {
    if (error_file == output_file)
      {
      merge_output = true;
      }
    else
      {
      cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDERR,
                               error_file.c_str());
      }
    }
  if (!output_variable.empty() && output_variable == error_variable)
    {
    merge_output = true;
    }
  if (merge_output)
    {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_MergeOutput, 1);
    }

  // Set the timeout if any.
  if(timeout >= 0)
    {
    cmsysProcess_SetTimeout(cp, timeout);
    }

  // Start the process.
  cmsysProcess_Execute(cp);

  // Read the process output.
  std::vector<char> tempOutput;
  std::vector<char> tempError;
  int length;
  char* data;
  int p;
  while((p = cmsysProcess_WaitForData(cp, &data, &length, 0), p))
    {
    // Put the output in the right place.
    if (p == cmsysProcess_Pipe_STDOUT && !output_quiet)
      {
      if(output_variable.empty())
        {
        cmSystemTools::Stdout(data, length);
        }
      else
        {
        cmExecuteProcessCommandAppend(tempOutput, data, length);
        }
      }
    else if(p == cmsysProcess_Pipe_STDERR && !error_quiet)
      {
      if(error_variable.empty())
        {
        cmSystemTools::Stderr(data, length);
        }
      else
        {
        cmExecuteProcessCommandAppend(tempError, data, length);
        }
      }
    }

  // All output has been read.  Wait for the process to exit.
  cmsysProcess_WaitForExit(cp, 0);

  // Fix the text in the output strings.
  cmExecuteProcessCommandFixText(tempOutput,
                                 output_strip_trailing_whitespace);
  cmExecuteProcessCommandFixText(tempError,
                                 error_strip_trailing_whitespace);

  // Store the output obtained.
  if(!output_variable.empty() && !tempOutput.empty())
    {
    this->Makefile->AddDefinition(output_variable,
                                  &*tempOutput.begin());
    }
  if(!merge_output && !error_variable.empty() && !tempError.empty())
    {
    this->Makefile->AddDefinition(error_variable,
                                  &*tempError.begin());
    }

  // Store the result of running the process.
  if(!result_variable.empty())
    {
    switch(cmsysProcess_GetState(cp))
      {
      case cmsysProcess_State_Exited:
        {
        int v = cmsysProcess_GetExitValue(cp);
        char buf[100];
        sprintf(buf, "%d", v);
        this->Makefile->AddDefinition(result_variable, buf);
        }
        break;
      case cmsysProcess_State_Exception:
        this->Makefile->AddDefinition(result_variable,
                                  cmsysProcess_GetExceptionString(cp));
        break;
      case cmsysProcess_State_Error:
        this->Makefile->AddDefinition(result_variable,
                                  cmsysProcess_GetErrorString(cp));
        break;
      case cmsysProcess_State_Expired:
        this->Makefile->AddDefinition(result_variable,
                                  "Process terminated due to timeout");
        break;
      }
    }

  // Delete the process instance.
  cmsysProcess_Delete(cp);

  return true;
}